

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCl.c
# Opt level: O0

uint32_t Hacl_SecretBox_ZeroPad_crypto_secretbox_detached
                   (uint8_t *c,uint8_t *mac,uint8_t *m,uint64_t mlen,uint8_t *n1,uint8_t *k1)

{
  undefined4 in_ECX;
  uint8_t *in_RDI;
  uint8_t *in_R9;
  uint8_t subkey [32];
  uint32_t mlen_;
  uint8_t *in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  
  memset(&stack0xffffffffffffffa8,0,0x20);
  Hacl_Salsa20_hsalsa20(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint8_t *)0x11aa0c);
  Hacl_Salsa20_salsa20
            (in_R9,(uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(uint64_t)in_stack_ffffffffffffffa8
            );
  Hacl_Poly1305_64_crypto_onetimeauth
            ((uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,(uint64_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
            );
  Hacl_SecretBox_ZeroPad_set_zero_bytes(in_RDI);
  Hacl_SecretBox_ZeroPad_set_zero_bytes(&stack0xffffffffffffffa8);
  return 0;
}

Assistant:

static uint32_t
Hacl_SecretBox_ZeroPad_crypto_secretbox_detached(
  uint8_t *c,
  uint8_t *mac,
  uint8_t *m,
  uint64_t mlen,
  uint8_t *n1,
  uint8_t *k1
)
{
  uint32_t mlen_ = (uint32_t)mlen;
  uint8_t subkey[32U] = { 0U };
  Hacl_Salsa20_hsalsa20(subkey, k1, n1);
  Hacl_Salsa20_salsa20(c, m, mlen_ + (uint32_t)32U, subkey, n1 + (uint32_t)16U, (uint64_t)0U);
  Hacl_Poly1305_64_crypto_onetimeauth(mac, c + (uint32_t)32U, mlen, c);
  Hacl_SecretBox_ZeroPad_set_zero_bytes(c);
  Hacl_SecretBox_ZeroPad_set_zero_bytes(subkey);
  return (uint32_t)0U;
}